

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.h
# Opt level: O3

int __thiscall InvertDatabase::in_mem(InvertDatabase *this,int it)

{
  long *plVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  plVar1 = *(long **)&(((this->_items).
                        super__Vector_base<std::shared_ptr<Itemset>,_std::allocator<std::shared_ptr<Itemset>_>_>
                        ._M_impl.super__Vector_impl_data._M_start
                        [(this->fidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[it]].
                        super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->theIval).
                      super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>;
  lVar2 = *plVar1;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar1[1];
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return (int)(lVar2 != 0);
}

Assistant:

int in_mem(int it) {
        if (_items[fidx[it]]->ival()->array() == nullptr) return 0;
        else return 1;
    }